

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O3

void __thiscall HelloWorld::Append(HelloWorld *this,string *add)

{
  ostream *poVar1;
  stringstream ss;
  long *local_1b8 [2];
  long local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_188,(this->m_Message)._M_dataplus._M_p,
                      (this->m_Message)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(add->_M_dataplus)._M_p,add->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void HelloWorld::Append(const std::string &add)
{
    std::stringstream ss;
    ss << m_Message << add;
    m_Message = ss.str();
}